

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS ref_mpi_stopwatch_start(REF_MPI ref_mpi)

{
  clock_t cVar1;
  
  cVar1 = clock();
  ref_mpi->start_time = (double)cVar1 / 1000000.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stopwatch_start(REF_MPI ref_mpi) {
#ifdef HAVE_MPI
  if (ref_mpi_para(ref_mpi)) MPI_Barrier(ref_mpi_comm(ref_mpi));
  ref_mpi->start_time = (REF_DBL)MPI_Wtime();
#else
  clock_t ticks;
  ticks = clock();
  ref_mpi->start_time = ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC);
#endif

  return REF_SUCCESS;
}